

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  FilePath *in_RDI;
  char cwd [4097];
  string *pathname;
  FilePath *this;
  allocator<char> *in_stack_ffffffffffffefc0;
  char *in_stack_ffffffffffffefc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefd0;
  string local_1018 [128];
  
  this = in_RDI;
  memset(local_1018,0,0x1001);
  pcVar1 = getcwd((char *)local_1018,0x1001);
  if (pcVar1 == (char *)0x0) {
    pathname = (string *)0x87e4ee;
  }
  else {
    pathname = local_1018;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
  FilePath(this,pathname);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffefc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffefc7);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}